

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue.hpp
# Opt level: O2

int __thiscall
lf_queue<ll_el<unsigned_int,_unsigned_int>_>::remove
          (lf_queue<ll_el<unsigned_int,_unsigned_int>_> *this,char *__filename)

{
  pointer puVar1;
  uint f;
  pointer puVar2;
  pointer pvVar3;
  uint extraout_EAX;
  uint uVar4;
  mapped_type *pmVar5;
  key_type local_28;
  
  local_28 = (key_type)__filename;
  pmVar5 = std::__detail::
           _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->H,&local_28);
  f = pmVar5->F_ab;
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(&(this->H)._M_h,&local_28);
  puVar2 = (this->F_size).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = puVar2 + f;
  *puVar1 = *puVar1 - 1;
  this->current_size = this->current_size - 1;
  pvVar3 = (this->F).
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = puVar2[f];
  if ((ulong)uVar4 <
      (ulong)((long)*(pointer *)
                     ((long)&pvVar3[f].
                             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              *(long *)&pvVar3[f].
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data >> 3) >> 1) {
    compact_ll(this,f);
    uVar4 = extraout_EAX;
  }
  return uVar4;
}

Assistant:

void remove(cpair ab){

		assert(contains(ab));
		assert(max_size>0);

		h_el_t el = H[ab];
		H.erase(ab);//remove pair from hash

		assert(F_size[el.F_ab]>0);
		F_size[el.F_ab]--;

		assert(current_size>0);
		current_size--;

		//if more than half of B's entries are empty, compact B.
		if(F_size[el.F_ab] < F[el.F_ab].size()/2)
			compact_ll(el.F_ab);

	}